

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O0

RPCHelpMan * wallet::sendtoaddress(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> results;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_ffffffffffffdba8;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffdbb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbc0;
  RPCResults *in_stack_ffffffffffffdbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdbe0;
  UniValue *in_stack_ffffffffffffdbe8;
  iterator in_stack_ffffffffffffdbf0;
  RPCArgOptions *in_stack_ffffffffffffdbf8;
  string *in_stack_ffffffffffffdc00;
  undefined7 in_stack_ffffffffffffdc08;
  undefined1 in_stack_ffffffffffffdc0f;
  undefined4 in_stack_ffffffffffffdc10;
  Type in_stack_ffffffffffffdc14;
  string *in_stack_ffffffffffffdc18;
  undefined4 in_stack_ffffffffffffdc20;
  Type in_stack_ffffffffffffdc24;
  undefined4 in_stack_ffffffffffffdc28;
  Type in_stack_ffffffffffffdc2c;
  RPCResult *in_stack_ffffffffffffdc30;
  undefined1 *local_23c0;
  undefined1 *local_23a8;
  undefined1 *local_2390;
  RPCExamples *examples;
  RPCResults *results_00;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  RPCMethodImpl *fun;
  undefined1 local_2130 [34];
  allocator<char> local_210e;
  allocator<char> local_210d;
  allocator<char> local_210c;
  allocator<char> local_210b;
  allocator<char> local_210a [2];
  pointer local_2108;
  pointer pRStack_2100;
  pointer local_20f8;
  allocator<char> local_20ea;
  allocator<char> local_20e9 [31];
  allocator<char> local_20ca;
  allocator<char> local_20c9 [30];
  undefined1 local_20ab;
  undefined1 local_20aa;
  undefined1 local_20a9 [30];
  undefined1 local_208b [2];
  allocator<char> local_2089 [29];
  allocator<char> local_206c;
  undefined1 local_206b [2];
  allocator<char> local_2069;
  allocator<char> local_2068;
  allocator<char> local_2067 [2];
  allocator<char> local_2065;
  allocator<char> local_2064;
  allocator<char> local_2063;
  allocator<char> local_2062;
  allocator<char> local_2061;
  allocator<char> local_2060;
  allocator<char> local_205f;
  allocator<char> local_205e;
  allocator<char> local_205d;
  allocator<char> local_205c;
  undefined1 local_205b;
  allocator<char> local_205a;
  allocator<char> local_2059;
  undefined1 local_2058 [7];
  allocator<char> local_2051 [8];
  allocator<char> local_2049;
  undefined4 local_2048;
  allocator<char> local_2042;
  allocator<char> local_2041;
  undefined4 local_2040;
  allocator<char> local_2039 [32];
  allocator<char> local_2019 [25];
  undefined8 local_2000;
  undefined1 local_1ab8 [272];
  undefined1 local_19a8 [192];
  undefined1 local_18e8 [136];
  vector<RPCArg,_std::allocator<RPCArg>_> local_1860 [5];
  undefined1 local_17d8 [40];
  undefined8 local_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined1 local_1798;
  undefined1 local_1797;
  undefined1 local_1698;
  undefined8 local_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined1 local_1658;
  undefined1 local_1657;
  undefined1 local_1570;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined1 local_1530;
  undefined1 local_152f;
  undefined1 local_1430;
  undefined8 local_1408;
  undefined8 uStack_1400;
  undefined8 local_13f8;
  undefined1 local_13f0;
  undefined1 local_13ef;
  undefined1 local_12b0;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined1 local_1270;
  undefined1 local_126f;
  undefined1 local_11a8;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 local_1170;
  undefined1 local_1168;
  undefined1 local_1167;
  undefined1 local_10a0;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined8 local_1068;
  undefined1 local_1060;
  undefined1 local_105f;
  undefined8 local_1000;
  undefined1 local_f60;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  undefined1 local_f20;
  undefined1 local_f1f;
  undefined1 local_e78;
  undefined8 local_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined1 local_e38;
  undefined1 local_e37;
  undefined1 local_d90;
  undefined8 local_d68;
  undefined8 uStack_d60;
  undefined8 local_d58;
  undefined1 local_d50;
  undefined1 local_d4f;
  undefined1 local_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined1 local_c48;
  undefined1 local_c47;
  undefined1 local_ba0 [528];
  RPCMethodImpl local_990 [74];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_2000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2040 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,&in_stack_ffffffffffffdbb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_c88 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_c60 = 0;
  uStack_c58 = 0;
  local_c50 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_c48 = 0;
  local_c47 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2048 = 0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,&in_stack_ffffffffffffdbb0->typ);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  local_d90 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_d68 = 0;
  uStack_d60 = 0;
  local_d58 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_d50 = 0;
  local_d4f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  fun = local_990;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2051[1] = (allocator<char>)0x1;
  local_2051[2] = (allocator<char>)0x0;
  local_2051[3] = (allocator<char>)0x0;
  local_2051[4] = (allocator<char>)0x0;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,&in_stack_ffffffffffffdbb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_e78 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_e50 = 0;
  uStack_e48 = 0;
  local_e40 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_e38 = 0;
  local_e37 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2058._0_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,&in_stack_ffffffffffffdbb0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_f60 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_f38 = 0;
  uStack_f30 = 0;
  local_f28 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_f20 = 0;
  local_f1f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_205b = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdbe8,(bool *)in_stack_ffffffffffffdbe0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_10a0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1078 = 0;
  uStack_1070 = 0;
  local_1068 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1060 = 0;
  local_105f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_11a8 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1180 = 0;
  uStack_1178 = 0;
  local_1170 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1168 = 0;
  local_1167 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_12b0 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1288 = 0;
  uStack_1280 = 0;
  local_1278 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1270 = 0;
  local_126f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>
            ((UniValue *)in_stack_ffffffffffffdbf0,(char (*) [6])in_stack_ffffffffffffdbe8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  common::FeeModesDetail((string *)in_stack_ffffffffffffdbf8);
  std::operator+((char *)in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  local_1430 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1408 = 0;
  uStack_1400 = 0;
  local_13f8 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_13f0 = 0;
  local_13ef = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2067[1] = (allocator<char>)0x1;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdbe8,(bool *)in_stack_ffffffffffffdbe0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_1570 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1548 = 0;
  uStack_1540 = 0;
  local_1538 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1530 = 0;
  local_152f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbb0);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  local_1698 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_1670 = 0;
  uStack_1668 = 0;
  local_1660 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1658 = 0;
  local_1657 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_206b[0] = '\0';
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffdbe8,(bool *)in_stack_ffffffffffffdbe0);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffdbb8,in_stack_ffffffffffffdbb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_17d8[0] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffdbc0);
  local_17b0 = 0;
  uStack_17a8 = 0;
  local_17a0 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffdba8);
  local_1798 = 0;
  local_1797 = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
                 in_stack_ffffffffffffdc18,in_stack_ffffffffffffdc14,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08),
                 in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8);
  std::allocator<RPCArg>::allocator((allocator<RPCArg> *)in_stack_ffffffffffffdba8);
  __l._M_len = (size_type)in_stack_ffffffffffffdbf8;
  __l._M_array = in_stack_ffffffffffffdbf0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdbe8,__l,
             (allocator_type *)in_stack_ffffffffffffdbe0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  this_00 = (RPCHelpMan *)local_208b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_20a9._1_8_ = 0;
  local_20a9._9_8_ = 0;
  local_20a9._17_8_ = 0;
  name = (string *)(local_20a9 + 1);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdba8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdc30,
             (string *)CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28),
             in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc18,
             (string *)CONCAT44(in_stack_ffffffffffffdc14,in_stack_ffffffffffffdc10),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08));
  args = local_1860;
  description = (string *)local_20a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  results_00 = (RPCResults *)&local_20aa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  examples = (RPCExamples *)&local_20ab;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_20e9[1] = (allocator<char>)0x0;
  local_20e9[2] = (allocator<char>)0x0;
  local_20e9[3] = (allocator<char>)0x0;
  local_20e9[4] = (allocator<char>)0x0;
  local_20e9[5] = (allocator<char>)0x0;
  local_20e9[6] = (allocator<char>)0x0;
  local_20e9[7] = (allocator<char>)0x0;
  local_20e9[8] = (allocator<char>)0x0;
  local_20e9[9] = (allocator<char>)0x0;
  local_20e9[10] = (allocator<char>)0x0;
  local_20e9[0xb] = (allocator<char>)0x0;
  local_20e9[0xc] = (allocator<char>)0x0;
  local_20e9[0xd] = (allocator<char>)0x0;
  local_20e9[0xe] = (allocator<char>)0x0;
  local_20e9[0xf] = (allocator<char>)0x0;
  local_20e9[0x10] = (allocator<char>)0x0;
  local_20e9[0x11] = (allocator<char>)0x0;
  local_20e9[0x12] = (allocator<char>)0x0;
  local_20e9[0x13] = (allocator<char>)0x0;
  local_20e9[0x14] = (allocator<char>)0x0;
  local_20e9[0x15] = (allocator<char>)0x0;
  local_20e9[0x16] = (allocator<char>)0x0;
  local_20e9[0x17] = (allocator<char>)0x0;
  local_20e9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdba8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
             (string *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
             in_stack_ffffffffffffdc18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdc14,in_stack_ffffffffffffdc10),
             (bool)in_stack_ffffffffffffdc0f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  local_2108 = (pointer)0x0;
  pRStack_2100 = (pointer)0x0;
  local_20f8 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdba8);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc2c,
             (string *)CONCAT44(in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc20),
             in_stack_ffffffffffffdc18,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffdc14,in_stack_ffffffffffffdc10),
             (bool)in_stack_ffffffffffffdc0f);
  std::allocator<RPCResult>::allocator(in_stack_ffffffffffffdba8);
  __l_00._M_len = (size_type)in_stack_ffffffffffffdbf8;
  __l_00._M_array = (iterator)in_stack_ffffffffffffdbf0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdbe8,__l_00,
             (allocator_type *)in_stack_ffffffffffffdbe0);
  RPCResult::RPCResult
            (in_stack_ffffffffffffdc30,
             (string *)CONCAT44(in_stack_ffffffffffffdc2c,in_stack_ffffffffffffdc28),
             in_stack_ffffffffffffdc24,in_stack_ffffffffffffdc18,
             (string *)CONCAT44(in_stack_ffffffffffffdc14,in_stack_ffffffffffffdc10),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT17(in_stack_ffffffffffffdc0f,in_stack_ffffffffffffdc08));
  results._M_len = (size_type)in_stack_ffffffffffffdbf8;
  results._M_array = (iterator)in_stack_ffffffffffffdbf0;
  RPCResults::RPCResults(in_stack_ffffffffffffdbd0,results);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+((char *)in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::operator+(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::operator+(in_stack_ffffffffffffdbc0,in_stack_ffffffffffffdbb8);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdbf8,(char *)in_stack_ffffffffffffdbf0,
             (allocator<char> *)in_stack_ffffffffffffdbe8);
  std::operator+(&in_stack_ffffffffffffdbf8->skip_type_check,&in_stack_ffffffffffffdbf0->m_names);
  std::operator+(in_stack_ffffffffffffdbc0,(char *)in_stack_ffffffffffffdbb8);
  HelpExampleCli(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  std::operator+(in_stack_ffffffffffffdbe0,in_stack_ffffffffffffdbd8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_ffffffffffffdba8,(string *)0x1816d36);
  this = (RPCArg *)local_2130;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::sendtoaddress()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_ffffffffffffdbb8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffdbb0);
  RPCHelpMan::RPCHelpMan(this_00,name,description,args,results_00,examples,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2130 + 0x21));
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_210e);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_210d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_210c);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_210b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_210a);
  RPCResults::~RPCResults((RPCResults *)this);
  local_2390 = local_17d8;
  do {
    local_2390 = local_2390 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_2390 != local_18e8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdbb8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_23a8 = local_19a8;
  do {
    local_23a8 = local_23a8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_23a8 != local_1ab8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdbb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_20ea);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_20e9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdbb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_20ca);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_20c9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_20ab);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_20aa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_20a9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffdbb8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_208b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_208b + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2089);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffdbb8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_23c0 = local_48;
  do {
    local_23c0 = local_23c0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_23c0 != local_ba0);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_206c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_206b + 1));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2069);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2068);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2067);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2065);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2064);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2063);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2062);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2061);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2060);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_205f);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_205e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_205d);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_205c);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_205a);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2059);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_2058 + 6));
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2051);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2049);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2042);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_2041);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2039);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_2019);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan sendtoaddress()
{
    return RPCHelpMan{"sendtoaddress",
                "\nSend an amount to a given address." +
        HELP_REQUIRING_PASSPHRASE,
                {
                    {"address", RPCArg::Type::STR, RPCArg::Optional::NO, "The bitcoin address to send to."},
                    {"amount", RPCArg::Type::AMOUNT, RPCArg::Optional::NO, "The amount in " + CURRENCY_UNIT + " to send. eg 0.1"},
                    {"comment", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A comment used to store what the transaction is for.\n"
                                         "This is not part of the transaction, just kept in your wallet."},
                    {"comment_to", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A comment to store the name of the person or organization\n"
                                         "to which you're sending the transaction. This is not part of the \n"
                                         "transaction, just kept in your wallet."},
                    {"subtractfeefromamount", RPCArg::Type::BOOL, RPCArg::Default{false}, "The fee will be deducted from the amount being sent.\n"
                                         "The recipient will receive less bitcoins than you enter in the amount field."},
                    {"replaceable", RPCArg::Type::BOOL, RPCArg::DefaultHint{"wallet default"}, "Signal that this transaction can be replaced by a transaction (BIP 125)"},
                    {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks"},
                    {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
                      + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"))},
                    {"avoid_reuse", RPCArg::Type::BOOL, RPCArg::Default{true}, "(only available if avoid_reuse wallet flag is set) Avoid spending from dirty addresses; addresses are considered\n"
                                         "dirty if they have previously been used in a transaction. If true, this also activates avoidpartialspends, grouping outputs by their addresses."},
                    {"fee_rate", RPCArg::Type::AMOUNT, RPCArg::DefaultHint{"not set, fall back to wallet fee estimation"}, "Specify a fee rate in " + CURRENCY_ATOM + "/vB."},
                    {"verbose", RPCArg::Type::BOOL, RPCArg::Default{false}, "If true, return extra information about the transaction."},
                },
                {
                    RPCResult{"if verbose is not set or set to false",
                        RPCResult::Type::STR_HEX, "txid", "The transaction id."
                    },
                    RPCResult{"if verbose is set to true",
                        RPCResult::Type::OBJ, "", "",
                        {
                            {RPCResult::Type::STR_HEX, "txid", "The transaction id."},
                            {RPCResult::Type::STR, "fee_reason", "The transaction fee reason."}
                        },
                    },
                },
                RPCExamples{
                    "\nSend 0.1 BTC\n"
                    + HelpExampleCli("sendtoaddress", "\"" + EXAMPLE_ADDRESS[0] + "\" 0.1") +
                    "\nSend 0.1 BTC with a confirmation target of 6 blocks in economical fee estimate mode using positional arguments\n"
                    + HelpExampleCli("sendtoaddress", "\"" + EXAMPLE_ADDRESS[0] + "\" 0.1 \"donation\" \"sean's outpost\" false true 6 economical") +
                    "\nSend 0.1 BTC with a fee rate of 1.1 " + CURRENCY_ATOM + "/vB, subtract fee from amount, BIP125-replaceable, using positional arguments\n"
                    + HelpExampleCli("sendtoaddress", "\"" + EXAMPLE_ADDRESS[0] + "\" 0.1 \"drinks\" \"room77\" true true null \"unset\" null 1.1") +
                    "\nSend 0.2 BTC with a confirmation target of 6 blocks in economical fee estimate mode using named arguments\n"
                    + HelpExampleCli("-named sendtoaddress", "address=\"" + EXAMPLE_ADDRESS[0] + "\" amount=0.2 conf_target=6 estimate_mode=\"economical\"") +
                    "\nSend 0.5 BTC with a fee rate of 25 " + CURRENCY_ATOM + "/vB using named arguments\n"
                    + HelpExampleCli("-named sendtoaddress", "address=\"" + EXAMPLE_ADDRESS[0] + "\" amount=0.5 fee_rate=25")
                    + HelpExampleCli("-named sendtoaddress", "address=\"" + EXAMPLE_ADDRESS[0] + "\" amount=0.5 fee_rate=25 subtractfeefromamount=false replaceable=true avoid_reuse=true comment=\"2 pizzas\" comment_to=\"jeremy\" verbose=true")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    // Make sure the results are valid at least up to the most recent block
    // the user could have gotten from another RPC command prior to now
    pwallet->BlockUntilSyncedToCurrentChain();

    LOCK(pwallet->cs_wallet);

    // Wallet comments
    mapValue_t mapValue;
    if (!request.params[2].isNull() && !request.params[2].get_str().empty())
        mapValue["comment"] = request.params[2].get_str();
    if (!request.params[3].isNull() && !request.params[3].get_str().empty())
        mapValue["to"] = request.params[3].get_str();

    CCoinControl coin_control;
    if (!request.params[5].isNull()) {
        coin_control.m_signal_bip125_rbf = request.params[5].get_bool();
    }

    coin_control.m_avoid_address_reuse = GetAvoidReuseFlag(*pwallet, request.params[8]);
    // We also enable partial spend avoidance if reuse avoidance is set.
    coin_control.m_avoid_partial_spends |= coin_control.m_avoid_address_reuse;

    SetFeeEstimateMode(*pwallet, coin_control, /*conf_target=*/request.params[6], /*estimate_mode=*/request.params[7], /*fee_rate=*/request.params[9], /*override_min_fee=*/false);

    EnsureWalletIsUnlocked(*pwallet);

    UniValue address_amounts(UniValue::VOBJ);
    const std::string address = request.params[0].get_str();
    address_amounts.pushKV(address, request.params[1]);
    std::vector<CRecipient> recipients = CreateRecipients(
            ParseOutputs(address_amounts),
            InterpretSubtractFeeFromOutputInstructions(request.params[4], address_amounts.getKeys())
    );
    const bool verbose{request.params[10].isNull() ? false : request.params[10].get_bool()};

    return SendMoney(*pwallet, coin_control, recipients, mapValue, verbose);
},
    };
}